

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O0

void __thiscall TEST_SimpleString_StrStr_Test::testBody(TEST_SimpleString_StrStr_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  char local_24 [8];
  char barf [5];
  char foobarfoo [10];
  char empty [1];
  char foo [4];
  TEST_SimpleString_StrStr_Test *this_local;
  
  builtin_strncpy(foobarfoo + 3,"foo",4);
  unique0x100003d5 = this;
  memset(foobarfoo + 2,0,1);
  local_24[5] = 'f';
  local_24[6] = 'o';
  local_24[7] = 'o';
  builtin_strncpy(barf,"barfo",5);
  foobarfoo[0] = 'o';
  foobarfoo[1] = '\0';
  builtin_strncpy(local_24,"barf",5);
  pUVar1 = UtestShell::getCurrent();
  pcVar2 = SimpleString::StrStr(foobarfoo + 3,foobarfoo + 2);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[8])
            (pUVar1,(ulong)(pcVar2 == foobarfoo + 3),"CHECK",
             "SimpleString::StrStr(foo, empty) == foo",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x411,pTVar3);
  pUVar1 = UtestShell::getCurrent();
  pcVar2 = SimpleString::StrStr(foobarfoo + 2,foobarfoo + 3);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[8])
            (pUVar1,(ulong)(pcVar2 == (char *)0x0),"CHECK",
             "SimpleString::StrStr(empty, foo) == NULLPTR",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x412,pTVar3);
  pUVar1 = UtestShell::getCurrent();
  pcVar2 = SimpleString::StrStr(local_24 + 5,local_24);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[8])
            (pUVar1,(ulong)(pcVar2 == barf),"CHECK",
             "SimpleString::StrStr(foobarfoo, barf) == foobarfoo+3",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x413,pTVar3);
  pUVar1 = UtestShell::getCurrent();
  pcVar2 = SimpleString::StrStr(local_24,local_24 + 5);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[8])
            (pUVar1,(ulong)(pcVar2 == (char *)0x0),"CHECK",
             "SimpleString::StrStr(barf, foobarfoo) == NULLPTR",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x414,pTVar3);
  pUVar1 = UtestShell::getCurrent();
  pcVar2 = SimpleString::StrStr(foobarfoo + 3,foobarfoo + 3);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[8])
            (pUVar1,(ulong)(pcVar2 == foobarfoo + 3),"CHECK","SimpleString::StrStr(foo, foo) == foo"
             ,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x415,pTVar3);
  return;
}

Assistant:

TEST(SimpleString, StrStr)
{
    char foo[] = "foo";
    char empty[] = "";
    char foobarfoo[] = "foobarfoo";
    char barf[] = "barf";
    CHECK(SimpleString::StrStr(foo, empty) == foo);
    CHECK(SimpleString::StrStr(empty, foo) == NULLPTR);
    CHECK(SimpleString::StrStr(foobarfoo, barf) == foobarfoo+3);
    CHECK(SimpleString::StrStr(barf, foobarfoo) == NULLPTR);
    CHECK(SimpleString::StrStr(foo, foo) == foo);
}